

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::CollationIterator::appendNumericCEs
          (CollationIterator *this,uint32_t ce32,UBool forward,UErrorCode *errorCode)

{
  char cVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  char *pcVar5;
  bool bVar6;
  int local_a0;
  int local_9c;
  int32_t segmentLength;
  int32_t pos;
  char *pcStack_90;
  char digit_2;
  char *q;
  char *p;
  UChar32 c_1;
  char digit_1;
  UChar32 c;
  undefined1 local_60 [7];
  char digit;
  CharString digits;
  UErrorCode *errorCode_local;
  UBool forward_local;
  uint32_t ce32_local;
  CollationIterator *this_local;
  
  digits._56_8_ = errorCode;
  CharString::CharString((CharString *)local_60);
  errorCode_local._4_4_ = ce32;
  if (forward == '\0') {
    do {
      cVar1 = Collation::digitFromCE32(errorCode_local._4_4_);
      CharString::append((CharString *)local_60,cVar1,(UErrorCode *)digits._56_8_);
      iVar3 = (*(this->super_UObject)._vptr_UObject[7])(this,digits._56_8_);
      if (iVar3 < 0) goto LAB_0029c60b;
      errorCode_local._4_4_ = CollationData::getCE32(this->data,iVar3);
      if (errorCode_local._4_4_ == 0xc0) {
        errorCode_local._4_4_ = CollationData::getCE32(this->data->base,iVar3);
      }
      UVar2 = Collation::hasCE32Tag(errorCode_local._4_4_,10);
    } while (UVar2 != '\0');
    (*(this->super_UObject)._vptr_UObject[0xc])(this,1,digits._56_8_);
LAB_0029c60b:
    q = CharString::data((CharString *)local_60);
    iVar4 = CharString::length((CharString *)local_60);
    pcStack_90 = q + iVar4;
    while (pcStack_90 = pcStack_90 + -1, q < pcStack_90) {
      cVar1 = *q;
      *q = *pcStack_90;
      *pcStack_90 = cVar1;
      q = q + 1;
    }
  }
  else {
    while( true ) {
      cVar1 = Collation::digitFromCE32(errorCode_local._4_4_);
      CharString::append((CharString *)local_60,cVar1,(UErrorCode *)digits._56_8_);
      if ((this->numCpFwd == 0) ||
         (iVar3 = (*(this->super_UObject)._vptr_UObject[6])(this,digits._56_8_), iVar3 < 0))
      goto LAB_0029c6b6;
      errorCode_local._4_4_ = CollationData::getCE32(this->data,iVar3);
      if (errorCode_local._4_4_ == 0xc0) {
        errorCode_local._4_4_ = CollationData::getCE32(this->data->base,iVar3);
      }
      UVar2 = Collation::hasCE32Tag(errorCode_local._4_4_,10);
      if (UVar2 == '\0') break;
      if (0 < this->numCpFwd) {
        this->numCpFwd = this->numCpFwd + -1;
      }
    }
    (*(this->super_UObject)._vptr_UObject[0xd])(this,1,digits._56_8_);
  }
LAB_0029c6b6:
  UVar2 = ::U_FAILURE(*(UErrorCode *)digits._56_8_);
  if (UVar2 == '\0') {
    local_9c = 0;
    do {
      while( true ) {
        iVar4 = CharString::length((CharString *)local_60);
        bVar6 = false;
        if (local_9c < iVar4 + -1) {
          cVar1 = CharString::operator[]((CharString *)local_60,local_9c);
          bVar6 = cVar1 == '\0';
        }
        if (!bVar6) break;
        local_9c = local_9c + 1;
      }
      iVar4 = CharString::length((CharString *)local_60);
      local_a0 = iVar4 - local_9c;
      if (0xfe < local_a0) {
        local_a0 = 0xfe;
      }
      pcVar5 = CharString::data((CharString *)local_60);
      appendNumericSegmentCEs(this,pcVar5 + local_9c,local_a0,(UErrorCode *)digits._56_8_);
      local_9c = local_a0 + local_9c;
      UVar2 = ::U_SUCCESS(*(UErrorCode *)digits._56_8_);
      bVar6 = false;
      if (UVar2 != '\0') {
        iVar4 = CharString::length((CharString *)local_60);
        bVar6 = local_9c < iVar4;
      }
    } while (bVar6);
  }
  CharString::~CharString((CharString *)local_60);
  return;
}

Assistant:

void
CollationIterator::appendNumericCEs(uint32_t ce32, UBool forward, UErrorCode &errorCode) {
    // Collect digits.
    CharString digits;
    if(forward) {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            if(numCpFwd == 0) { break; }
            UChar32 c = nextCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                backwardNumCodePoints(1, errorCode);
                break;
            }
            if(numCpFwd > 0) { --numCpFwd; }
        }
    } else {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            UChar32 c = previousCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                forwardNumCodePoints(1, errorCode);
                break;
            }
        }
        // Reverse the digit string.
        char *p = digits.data();
        char *q = p + digits.length() - 1;
        while(p < q) {
            char digit = *p;
            *p++ = *q;
            *q-- = digit;
        }
    }
    if(U_FAILURE(errorCode)) { return; }
    int32_t pos = 0;
    do {
        // Skip leading zeros.
        while(pos < (digits.length() - 1) && digits[pos] == 0) { ++pos; }
        // Write a sequence of CEs for at most 254 digits at a time.
        int32_t segmentLength = digits.length() - pos;
        if(segmentLength > 254) { segmentLength = 254; }
        appendNumericSegmentCEs(digits.data() + pos, segmentLength, errorCode);
        pos += segmentLength;
    } while(U_SUCCESS(errorCode) && pos < digits.length());
}